

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O1

void optimal_free(_encode_match_data *emd)

{
  void *pvVar1;
  undefined8 *__ptr;
  void *pvVar2;
  void *pvVar3;
  
  pvVar1 = emd->priv;
  __ptr = *(undefined8 **)((long)pvVar1 + 0x28);
  if (__ptr != (undefined8 *)0x0) {
    pvVar3 = (void *)*__ptr;
    while (pvVar3 != (void *)0x0) {
      pvVar2 = *(void **)((long)pvVar3 + 8);
      free(pvVar3);
      pvVar3 = pvVar2;
    }
    pvVar3 = (void *)__ptr[1];
    while (pvVar3 != (void *)0x0) {
      pvVar2 = *(void **)((long)pvVar3 + 8);
      free(pvVar3);
      pvVar3 = pvVar2;
    }
    pvVar3 = (void *)__ptr[2];
    while (pvVar3 != (void *)0x0) {
      pvVar2 = *(void **)((long)pvVar3 + 8);
      free(pvVar3);
      pvVar3 = pvVar2;
    }
    pvVar3 = (void *)__ptr[3];
    while (pvVar3 != (void *)0x0) {
      pvVar2 = *(void **)((long)pvVar3 + 8);
      free(pvVar3);
      pvVar3 = pvVar2;
    }
    pvVar3 = (void *)__ptr[4];
    while (pvVar3 != (void *)0x0) {
      pvVar2 = *(void **)((long)pvVar3 + 8);
      free(pvVar3);
      pvVar3 = pvVar2;
    }
    pvVar3 = (void *)__ptr[5];
    while (pvVar3 != (void *)0x0) {
      pvVar2 = *(void **)((long)pvVar3 + 8);
      free(pvVar3);
      pvVar3 = pvVar2;
    }
    pvVar3 = (void *)__ptr[6];
    while (pvVar3 != (void *)0x0) {
      pvVar2 = *(void **)((long)pvVar3 + 8);
      free(pvVar3);
      pvVar3 = pvVar2;
    }
    pvVar3 = (void *)__ptr[7];
    while (pvVar3 != (void *)0x0) {
      pvVar2 = *(void **)((long)pvVar3 + 8);
      free(pvVar3);
      pvVar3 = pvVar2;
    }
  }
  free(__ptr);
  pvVar3 = *(void **)((long)pvVar1 + 0x30);
  while (pvVar3 != (void *)0x0) {
    pvVar2 = *(void **)((long)pvVar3 + 8);
    free(pvVar3);
    pvVar3 = pvVar2;
  }
  *(undefined8 *)((long)pvVar1 + 0x28) = 0;
  *(undefined8 *)((long)pvVar1 + 0x30) = 0;
  return;
}

Assistant:

void optimal_free(encode_match_data emd)        /* IN */
{
    encode_match_privp data;
    interval_nodep *inpp;
    interval_nodep inp;

    data = emd->priv;

    inpp = data->offset_f_priv;
    if (inpp != NULL)
    {
        interval_node_delete(inpp[0]);
        interval_node_delete(inpp[1]);
        interval_node_delete(inpp[2]);
        interval_node_delete(inpp[3]);
        interval_node_delete(inpp[4]);
        interval_node_delete(inpp[5]);
        interval_node_delete(inpp[6]);
        interval_node_delete(inpp[7]);
    }
    free(inpp);

    inp = data->len_f_priv;
    interval_node_delete(inp);

    data->offset_f_priv = NULL;
    data->len_f_priv = NULL;
}